

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O0

int light_iterate(light_pcapng pcapng,_func_light_boolean_light_pcapng_void_ptr *stop_fn,void *args)

{
  int iVar1;
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  light_pcapng iterator;
  int iterations;
  long local_28;
  int local_1c;
  
  local_1c = 0;
  local_28 = in_RDI;
  while ((local_28 != 0 && (iVar1 = (*in_RSI)(local_28,in_RDX), iVar1 != 0))) {
    local_1c = local_1c + 1;
    local_28 = *(long *)(local_28 + 0x18);
  }
  return local_1c;
}

Assistant:

int light_iterate(const light_pcapng pcapng, light_boolean (*stop_fn)(const light_pcapng, void *), void *args)
{
	int iterations = 0;
	light_pcapng iterator = pcapng;

	while (iterator != NULL) {
		if (stop_fn(iterator, args) == LIGHT_FALSE) {
			break;
		}
		iterations++;
		iterator = iterator->next_block;
	}

	return iterations;
}